

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superscalar.cpp
# Opt level: O0

void __thiscall
defyx::SuperscalarInstructionInfo::SuperscalarInstructionInfo
          (SuperscalarInstructionInfo *this,char *name,SuperscalarInstructionType type,MacroOp *op,
          int srcOp)

{
  vector<defyx::MacroOp,_std::allocator<defyx::MacroOp>_> *pvVar1;
  int iVar2;
  MacroOp *in_RCX;
  undefined4 in_EDX;
  pointer in_RSI;
  vector<defyx::MacroOp,_std::allocator<defyx::MacroOp>_> *in_RDI;
  undefined4 in_R8D;
  value_type *__x;
  
  (in_RDI->super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>)._M_impl.
  super__Vector_impl_data._M_start = in_RSI;
  *(undefined4 *)
   &(in_RDI->super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>)._M_impl.
    super__Vector_impl_data._M_finish = in_EDX;
  __x = (value_type *)
        &(in_RDI->super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>)._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  std::vector<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>::vector
            ((vector<defyx::MacroOp,_std::allocator<defyx::MacroOp>_> *)0x12fc72);
  pvVar1 = in_RDI + 1;
  iVar2 = MacroOp::getLatency(in_RCX);
  *(int *)&(pvVar1->super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage = iVar2;
  *(undefined4 *)
   ((long)&in_RDI[1].super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined4 *)
   &in_RDI[2].super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>._M_impl.
    super__Vector_impl_data._M_start = 0;
  *(undefined4 *)
   ((long)&in_RDI[2].super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = in_R8D;
  std::vector<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>::push_back(in_RDI,__x);
  return;
}

Assistant:

SuperscalarInstructionInfo(const char* name, SuperscalarInstructionType type, const MacroOp& op, int srcOp)
			: name_(name), type_(type), latency_(op.getLatency()), srcOp_(srcOp) {
			ops_.push_back(MacroOp(op));
		}